

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O3

void __thiscall SMC::fragdis(SMC *this,string *fname,int label)

{
  double dVar1;
  pointer pbVar2;
  double (*paaadVar3) [20] [32] [32];
  char cVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  string line;
  ifstream input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  string local_280;
  double (*local_260) [20] [32] [32];
  double (*local_258) [20];
  double (*local_250) [20];
  double (*local_248) [20];
  double (*local_240) [20];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,(fname->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
    local_260 = this->etedCon + label;
    iVar5 = 0;
    local_248 = this->minDistcon + label;
    local_250 = this->DistconBy + label;
    local_258 = this->minDistdel + label;
    local_240 = this->DistdelBy + label;
    iVar7 = -1;
    do {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_280,cVar4);
      iVar8 = iVar7;
      if (*local_280._M_dataplus._M_p != '#') {
        local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        split(&local_280,' ',&local_298);
        paaadVar3 = local_260;
        pbVar2 = local_298.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)local_298.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_298.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (lVar6 == 4) {
          iVar8 = iVar7 + 1;
          dVar1 = atof(((local_298.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
          (*local_248)[(long)iVar7 + 1] = dVar1;
          dVar1 = atof(pbVar2[1]._M_dataplus._M_p);
          (*local_250)[(long)iVar7 + 1] = dVar1;
          dVar1 = atof(pbVar2[2]._M_dataplus._M_p);
          (*local_258)[(long)iVar7 + 1] = dVar1;
          dVar1 = atof(pbVar2[3]._M_dataplus._M_p);
          (*local_240)[(long)iVar7 + 1] = dVar1;
          iVar5 = 0;
        }
        else if (lVar6 == 0x20) {
          lVar6 = 0;
          do {
            dVar1 = atof(*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar6 * 4));
            *(double *)((long)(*paaadVar3)[iVar7][iVar5] + lVar6) = dVar1;
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x100);
          iVar5 = iVar5 + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_298);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      iVar7 = iVar8;
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void SMC::fragdis(string fname, int label) {
    // Populate etedP collection of distance lengths
    // Conditional distribution
    ifstream input(fname.c_str());
    int Countset = 0, FraglenCount = -1;
    while (!input.eof()) {
        // Read line
        string line;
        getline(input, line);
        if (line[0] == '#') continue;
        // Tokenize by tabs
        vector<string> token;
        split(line, ' ', token);
        if (token.size() == 4) {
            FraglenCount++;
            Countset = 0;
            minDistcon[label][FraglenCount] = atof(token[0].c_str());
            DistconBy[label][FraglenCount] = atof(token[1].c_str());
            minDistdel[label][FraglenCount] = atof(token[2].c_str());
            DistdelBy[label][FraglenCount] = atof(token[3].c_str());
        }
        else if (token.size() == 32) {
            for (int i = 0; i < 32; i++) {
                etedCon[label][FraglenCount][Countset][i] = atof(token[i].c_str());
            }
            Countset++;
        }
    }
}